

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

TestPartResult * __thiscall testing::TestResult::GetTestPartResult(TestResult *this,int i)

{
  pointer pTVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((-1 < i) &&
     (pTVar1 = (this->test_part_results_).
               super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
               ._M_impl.super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(this->test_part_results_).
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) >> 4) *
         -0x49249249)) {
    uVar3 = (ulong)(uint)i;
    uVar2 = ((long)(this->test_part_results_).
                   super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4) *
            0x6db6db6db6db6db7;
    if (uVar3 <= uVar2 && uVar2 - uVar3 != 0) {
      return pTVar1 + uVar3;
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  internal::posix::Abort();
}

Assistant:

const TestPartResult& TestResult::GetTestPartResult(int i) const {
  if (i < 0 || i >= total_part_count())
    internal::posix::Abort();
  return test_part_results_.at(static_cast<size_t>(i));
}